

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

void __thiscall rlib::JsonT<void>::clear(JsonT<void> *this)

{
  Type TVar1;
  
  TVar1 = this->m_type;
  if (TVar1 == Map) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                 *)&(this->field_1).m_string);
  }
  else if (TVar1 == Array) {
    std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::~vector
              ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
               &(this->field_1).m_string);
  }
  else if (TVar1 == String) {
    std::__cxx11::string::~string((string *)&(this->field_1).m_string);
  }
  this->m_type = Null;
  return;
}

Assistant:

void clear() {
			typedef std::string TypeString;
			switch (m_type) {
			case Type::String:	m_string.~TypeString();	break;
			case Type::Array:	m_array.~Array();		break;
			case Type::Map:		m_map.~Map();			break;
			default:		break;
			}
			m_type = Type::Null;
		}